

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecode.c
# Opt level: O3

void sysbvm_bytecode_setupPrimitives(sysbvm_context_t *context)

{
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context,"FunctionBytecode::Opcode::Nop",3);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"FunctionBytecode::Opcode::Breakpoint",0x13);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"FunctionBytecode::Opcode::Unreachable",0x23);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"FunctionBytecode::Opcode::Return",0x103);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"FunctionBytecode::Opcode::Jump",0x113);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"FunctionBytecode::Opcode::CountExtension",499);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"FunctionBytecode::Opcode::Alloca",0x203);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"FunctionBytecode::Opcode::Move",0x213);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"FunctionBytecode::Opcode::Load",0x223);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"FunctionBytecode::Opcode::LoadSymbolValueBinding",0x233);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"FunctionBytecode::Opcode::Store",0x243);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"FunctionBytecode::Opcode::JumpIfTrue",0x253);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"FunctionBytecode::Opcode::JumpIfFalse",0x263);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"FunctionBytecode::Opcode::SetDebugValue",0x273);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"FunctionBytecode::Opcode::AllocaWithValue",0x303);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"FunctionBytecode::Opcode::CoerceValue",0x313);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"FunctionBytecode::Opcode::DownCastValue",0x323);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"FunctionBytecode::Opcode::UncheckedDownCastValue",0x333);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"FunctionBytecode::Opcode::MakeAssociation",0x343);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"FunctionBytecode::Opcode::SlotAt",0x363);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"FunctionBytecode::Opcode::SlotReferenceAt",0x373);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"FunctionBytecode::Opcode::SlotAtPut",899);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"FunctionBytecode::Opcode::RefSlotAt",0x393);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"FunctionBytecode::Opcode::RefSlotReferenceAt",0x3a3);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"FunctionBytecode::Opcode::RefSlotAtPut",0x3b3);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"FunctionBytecode::Opcode::Call",0x403);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"FunctionBytecode::Opcode::UncheckedCall",0x503);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"FunctionBytecode::Opcode::Send",0x603);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"FunctionBytecode::Opcode::SendWithLookup",0x703);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"FunctionBytecode::Opcode::MakeArrayWithElements",0x803);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"FunctionBytecode::Opcode::MakeByteArrayWithElements",0x903);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"FunctionBytecode::Opcode::MakeClosureWithCaptures",0xa03);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"FunctionBytecode::Opcode::MakeDictionaryWithElements",0xb03);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"FunctionBytecode::Opcode::MakeTupleWithElements",0xc03);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"FunctionBytecode::Opcode::CaseJump",0xe03);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"FunctionBytecode::Opcode::FirstVariable",0x403);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"FunctionBytecode::OperandVectorName::Arguments",7);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"FunctionBytecode::OperandVectorName::Captures",0x17);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"FunctionBytecode::OperandVectorName::Literal",0x27);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"FunctionBytecode::OperandVectorName::Local",0x37);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"FunctionBytecode::OperandVectorName::Bits",0x27);
  sysbvm_context_setIntrinsicSymbolBindingNamedWithValue
            (context,"FunctionBytecode::OperandVectorName::BitMask",0x37);
  return;
}

Assistant:

void sysbvm_bytecode_setupPrimitives(sysbvm_context_t *context)
{
    // Export the function opcodes.

    // Zero operands.
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionBytecode::Opcode::Nop", sysbvm_tuple_uint8_encode(SYSBVM_OPCODE_NOP));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionBytecode::Opcode::Breakpoint", sysbvm_tuple_uint8_encode(SYSBVM_OPCODE_BREAKPOINT));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionBytecode::Opcode::Unreachable", sysbvm_tuple_uint8_encode(SYSBVM_OPCODE_UNREACHABLE));

    // One operands.
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionBytecode::Opcode::Return", sysbvm_tuple_uint8_encode(SYSBVM_OPCODE_RETURN));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionBytecode::Opcode::Jump", sysbvm_tuple_uint8_encode(SYSBVM_OPCODE_JUMP));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionBytecode::Opcode::CountExtension", sysbvm_tuple_uint8_encode(SYSBVM_OPCODE_COUNT_EXTENSION));

    // Two operands.
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionBytecode::Opcode::Alloca", sysbvm_tuple_uint8_encode(SYSBVM_OPCODE_ALLOCA));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionBytecode::Opcode::Move", sysbvm_tuple_uint8_encode(SYSBVM_OPCODE_MOVE));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionBytecode::Opcode::Load", sysbvm_tuple_uint8_encode(SYSBVM_OPCODE_LOAD));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionBytecode::Opcode::LoadSymbolValueBinding", sysbvm_tuple_uint8_encode(SYSBVM_OPCODE_LOAD_SYMBOL_VALUE_BINDING));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionBytecode::Opcode::Store", sysbvm_tuple_uint8_encode(SYSBVM_OPCODE_STORE));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionBytecode::Opcode::JumpIfTrue", sysbvm_tuple_uint8_encode(SYSBVM_OPCODE_JUMP_IF_TRUE));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionBytecode::Opcode::JumpIfFalse", sysbvm_tuple_uint8_encode(SYSBVM_OPCODE_JUMP_IF_FALSE));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionBytecode::Opcode::SetDebugValue", sysbvm_tuple_uint8_encode(SYSBVM_OPCODE_SET_DEBUG_VALUE));

    // Three operands.
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionBytecode::Opcode::AllocaWithValue", sysbvm_tuple_uint8_encode(SYSBVM_OPCODE_ALLOCA_WITH_VALUE));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionBytecode::Opcode::CoerceValue", sysbvm_tuple_uint8_encode(SYSBVM_OPCODE_COERCE_VALUE));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionBytecode::Opcode::DownCastValue", sysbvm_tuple_uint8_encode(SYSBVM_OPCODE_DOWNCAST_VALUE));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionBytecode::Opcode::UncheckedDownCastValue", sysbvm_tuple_uint8_encode(SYSBVM_OPCODE_UNCHECKED_DOWNCAST_VALUE));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionBytecode::Opcode::MakeAssociation", sysbvm_tuple_uint8_encode(SYSBVM_OPCODE_MAKE_ASSOCIATION));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionBytecode::Opcode::SlotAt", sysbvm_tuple_uint8_encode(SYSBVM_OPCODE_SLOT_AT));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionBytecode::Opcode::SlotReferenceAt", sysbvm_tuple_uint8_encode(SYSBVM_OPCODE_SLOT_REFERENCE_AT));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionBytecode::Opcode::SlotAtPut", sysbvm_tuple_uint8_encode(SYSBVM_OPCODE_SLOT_AT_PUT));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionBytecode::Opcode::RefSlotAt", sysbvm_tuple_uint8_encode(SYSBVM_OPCODE_REF_SLOT_AT));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionBytecode::Opcode::RefSlotReferenceAt", sysbvm_tuple_uint8_encode(SYSBVM_OPCODE_REF_SLOT_REFERENCE_AT));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionBytecode::Opcode::RefSlotAtPut", sysbvm_tuple_uint8_encode(SYSBVM_OPCODE_REF_SLOT_AT_PUT));

    // Variable operand count.
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionBytecode::Opcode::Call", sysbvm_tuple_uint8_encode(SYSBVM_OPCODE_CALL));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionBytecode::Opcode::UncheckedCall", sysbvm_tuple_uint8_encode(SYSBVM_OPCODE_UNCHECKED_CALL));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionBytecode::Opcode::Send", sysbvm_tuple_uint8_encode(SYSBVM_OPCODE_SEND));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionBytecode::Opcode::SendWithLookup", sysbvm_tuple_uint8_encode(SYSBVM_OPCODE_SEND_WITH_LOOKUP));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionBytecode::Opcode::MakeArrayWithElements", sysbvm_tuple_uint8_encode(SYSBVM_OPCODE_MAKE_ARRAY_WITH_ELEMENTS));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionBytecode::Opcode::MakeByteArrayWithElements", sysbvm_tuple_uint8_encode(SYSBVM_OPCODE_MAKE_BYTE_ARRAY_WITH_ELEMENTS));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionBytecode::Opcode::MakeClosureWithCaptures", sysbvm_tuple_uint8_encode(SYSBVM_OPCODE_MAKE_CLOSURE_WITH_CAPTURES));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionBytecode::Opcode::MakeDictionaryWithElements", sysbvm_tuple_uint8_encode(SYSBVM_OPCODE_MAKE_DICTIONARY_WITH_ELEMENTS));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionBytecode::Opcode::MakeTupleWithElements", sysbvm_tuple_uint8_encode(SYSBVM_OPCODE_MAKE_TUPLE_WITH_ELEMENTS));

    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionBytecode::Opcode::CaseJump", sysbvm_tuple_uint8_encode(SYSBVM_OPCODE_CASE_JUMP));

    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionBytecode::Opcode::FirstVariable", sysbvm_tuple_uint8_encode(SYSBVM_OPCODE_FIRST_VARIABLE));

    // Export the operand vector names.
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionBytecode::OperandVectorName::Arguments", sysbvm_tuple_int16_encode(SYSBVM_OPERAND_VECTOR_ARGUMENTS));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionBytecode::OperandVectorName::Captures", sysbvm_tuple_int16_encode(SYSBVM_OPERAND_VECTOR_CAPTURES));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionBytecode::OperandVectorName::Literal", sysbvm_tuple_int16_encode(SYSBVM_OPERAND_VECTOR_LITERAL));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionBytecode::OperandVectorName::Local", sysbvm_tuple_int16_encode(SYSBVM_OPERAND_VECTOR_LOCAL));

    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionBytecode::OperandVectorName::Bits", sysbvm_tuple_int16_encode(SYSBVM_OPERAND_VECTOR_BITS));
    sysbvm_context_setIntrinsicSymbolBindingNamedWithValue(context, "FunctionBytecode::OperandVectorName::BitMask", sysbvm_tuple_int16_encode(SYSBVM_OPERAND_VECTOR_BITMASK));
}